

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool parse_line_cap(element_t *element,int id,plutovg_line_cap_t *line_cap)

{
  _Bool _Var1;
  char *end_00;
  char *end;
  char *it;
  string_t *value;
  plutovg_line_cap_t *line_cap_local;
  element_t *peStack_18;
  int id_local;
  element_t *element_local;
  
  value = (string_t *)line_cap;
  line_cap_local._4_4_ = id;
  peStack_18 = element;
  it = (char *)find_attribute(element,id,true);
  if ((string_t *)it == (string_t *)0x0) {
    element_local._7_1_ = false;
  }
  else {
    end = ((string_t *)it)->data;
    end_00 = end + ((string_t *)it)->length;
    _Var1 = skip_string(&end,end_00,"butt");
    if (_Var1) {
      *(undefined4 *)&value->data = 0;
    }
    else {
      _Var1 = skip_string(&end,end_00,"round");
      if (_Var1) {
        *(undefined4 *)&value->data = 1;
      }
      else {
        _Var1 = skip_string(&end,end_00,"square");
        if (_Var1) {
          *(undefined4 *)&value->data = 2;
        }
      }
    }
    _Var1 = skip_ws(&end,end_00);
    element_local._7_1_ = (_Bool)((_Var1 ^ 0xffU) & 1);
  }
  return element_local._7_1_;
}

Assistant:

static bool parse_line_cap(const element_t* element, int id, plutovg_line_cap_t* line_cap)
{
    const string_t* value = find_attribute(element, id, true);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(skip_string(&it, end, "butt"))
        *line_cap = PLUTOVG_LINE_CAP_BUTT;
    else if(skip_string(&it, end, "round"))
        *line_cap = PLUTOVG_LINE_CAP_ROUND;
    else if(skip_string(&it, end, "square"))
        *line_cap = PLUTOVG_LINE_CAP_SQUARE;
    return !skip_ws(&it, end);
}